

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

void ssh1_rportfwd_response(ssh1_connection_state *s,_Bool success,void *ctx)

{
  LogContext *ctx_00;
  char *pcVar1;
  void *pvVar2;
  undefined7 in_register_00000031;
  
  ctx_00 = (s->ppl).logctx;
  if ((int)CONCAT71(in_register_00000031,success) != 0) {
    pcVar1 = dupprintf("Remote port forwarding from %s enabled",*(undefined8 *)((long)ctx + 0x20));
    logevent_and_free(ctx_00,pcVar1);
    return;
  }
  pcVar1 = dupprintf("Remote port forwarding from %s refused",*(undefined8 *)((long)ctx + 0x20));
  logevent_and_free(ctx_00,pcVar1);
  pvVar2 = del234(s->rportfwds,ctx);
  if (pvVar2 == ctx) {
    portfwdmgr_close(s->portfwdmgr,*(PortFwdRecord **)((long)ctx + 0x30));
    free_rportfwd((ssh_rportfwd *)ctx);
    return;
  }
  __assert_fail("realpf == rpf",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1-client.c"
                ,0x1ec,"void ssh1_rportfwd_response(struct ssh1_connection_state *, _Bool, void *)")
  ;
}

Assistant:

static void ssh1_rportfwd_response(struct ssh1_connection_state *s,
                                   bool success, void *ctx)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh_rportfwd *rpf = (struct ssh_rportfwd *)ctx;

    if (success) {
        ppl_logevent("Remote port forwarding from %s enabled",
                     rpf->log_description);
    } else {
        ppl_logevent("Remote port forwarding from %s refused",
                     rpf->log_description);

        struct ssh_rportfwd *realpf = del234(s->rportfwds, rpf);
        assert(realpf == rpf);
        portfwdmgr_close(s->portfwdmgr, rpf->pfr);
        free_rportfwd(rpf);
    }
}